

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int D_LoadDehLumps(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int lastlump;
  int local_2c;
  
  local_2c = 0;
  iVar3 = 0;
  while (iVar2 = FWadCollection::FindLump(&Wads,"DEHACKED",&local_2c,false), iVar4 = dehload.Value,
        -1 < iVar2) {
    bVar1 = D_LoadDehLump(iVar2);
    iVar3 = iVar3 + (uint)bVar1;
  }
  if ((PatchSize == 0) && (0 < dehload.Value)) {
    iVar2 = FWadCollection::GetNumLumps(&Wads);
    if (iVar4 == 1) {
      local_2c = iVar2;
      for (iVar4 = 0; iVar4 < local_2c; iVar4 = iVar4 + 1) {
        bVar1 = isDehFile(iVar4);
        if (bVar1) {
          bVar1 = D_LoadDehLump(iVar4);
          iVar3 = iVar3 + (uint)bVar1;
        }
      }
    }
    else {
      do {
        if (iVar2 < 1) {
          return iVar3;
        }
        iVar2 = iVar2 + -1;
        bVar1 = isDehFile(iVar2);
      } while (!bVar1);
      bVar1 = D_LoadDehLump(iVar2);
      iVar3 = iVar3 + (uint)bVar1;
    }
  }
  return iVar3;
}

Assistant:

int D_LoadDehLumps()
{
	int lastlump = 0, lumpnum, count = 0;

	while ((lumpnum = Wads.FindLump("DEHACKED", &lastlump)) >= 0)
	{
		count += D_LoadDehLump(lumpnum);
	}

	if (0 == PatchSize && dehload > 0)
	{
		// No DEH/BEX patch is loaded yet, try to find lump(s) with specific extensions

		if (dehload == 1)	// load all .DEH lumps that are found.
		{
			for (lumpnum = 0, lastlump = Wads.GetNumLumps(); lumpnum < lastlump; ++lumpnum)
			{
				if (isDehFile(lumpnum))
				{
					count += D_LoadDehLump(lumpnum);
				}
			}
		}
		else 	// only load the last .DEH lump that is found.
		{
			for (lumpnum = Wads.GetNumLumps()-1; lumpnum >=0; --lumpnum)
			{
				if (isDehFile(lumpnum))
				{
					count += D_LoadDehLump(lumpnum);
					break;
				}
			}
		}
	}

	return count;
}